

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_inc(void)

{
  char cVar1;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_380 [232];
  undefined1 local_298 [8];
  undefined1 local_290 [640];
  
  cVar1 = bson_init_from_json(auStack_380,"{ \"$inc\" : { \"ref\" : 1 } }",0xffffffffffffffff,
                              local_298);
  if (cVar1 != '\0') {
    bson_destroy(auStack_380);
    return;
  }
  fprintf(_stderr,"%s\n",local_290);
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x920,"test_bson_json_inc","r");
  abort();
}

Assistant:

static void
test_bson_json_inc (void)
{
   /* test that reproduces a bug with special mode checking.  Specifically,
    * mistaking '$inc' for '$id'
    *
    * From https://github.com/mongodb/mongo-c-driver/issues/62
    */
   bson_error_t error;
   const char *json = "{ \"$inc\" : { \"ref\" : 1 } }";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   bson_destroy (&b);
}